

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

size_t __thiscall
google::protobuf::internal::GeneratedMessageReflection::SpaceUsedLong
          (GeneratedMessageReflection *this,Message *message)

{
  bool bVar1;
  uint32 uVar2;
  CppType CVar3;
  int iVar4;
  UnknownFieldSet *this_00;
  ExtensionSet *this_01;
  FieldDescriptor *this_02;
  RepeatedField<long> *this_03;
  RepeatedField<unsigned_int> *this_04;
  RepeatedField<unsigned_long> *this_05;
  RepeatedField<double> *this_06;
  RepeatedField<float> *this_07;
  RepeatedField<bool> *this_08;
  RepeatedField<int> *pRVar5;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_09;
  MapFieldBase *this_10;
  RepeatedPtrFieldBase *this_11;
  OneofDescriptor *pOVar6;
  FieldOptions *pFVar7;
  ArenaStringPtr *pAVar8;
  string *psVar9;
  string *str;
  size_t sVar10;
  Message **ppMVar11;
  undefined4 extraout_var;
  Message *sub_message;
  string *ptr;
  string *default_ptr;
  FieldDescriptor *field;
  size_t sStack_20;
  int i;
  size_t total_size;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  uVar2 = ReflectionSchema::GetObjectSize(&this->schema_);
  this_00 = GetUnknownFields(this,message);
  sStack_20 = UnknownFieldSet::SpaceUsedExcludingSelfLong(this_00);
  sStack_20 = sStack_20 + uVar2;
  bVar1 = ReflectionSchema::HasExtensionSet(&this->schema_);
  if (bVar1) {
    this_01 = GetExtensionSet(this,message);
    sVar10 = ExtensionSet::SpaceUsedExcludingSelfLong(this_01);
    sStack_20 = sVar10 + sStack_20;
  }
  for (field._4_4_ = 0; field._4_4_ <= this->last_non_weak_field_index_;
      field._4_4_ = field._4_4_ + 1) {
    this_02 = Descriptor::field(this->descriptor_,field._4_4_);
    bVar1 = FieldDescriptor::is_repeated(this_02);
    if (bVar1) {
      CVar3 = FieldDescriptor::cpp_type(this_02);
      switch(CVar3) {
      case CPPTYPE_INT32:
        pRVar5 = GetRaw<google::protobuf::RepeatedField<int>>(this,message,this_02);
        sVar10 = RepeatedField<int>::SpaceUsedExcludingSelfLong(pRVar5);
        sStack_20 = sVar10 + sStack_20;
        break;
      case CPPTYPE_INT64:
        this_03 = GetRaw<google::protobuf::RepeatedField<long>>(this,message,this_02);
        sVar10 = RepeatedField<long>::SpaceUsedExcludingSelfLong(this_03);
        sStack_20 = sVar10 + sStack_20;
        break;
      case CPPTYPE_UINT32:
        this_04 = GetRaw<google::protobuf::RepeatedField<unsigned_int>>(this,message,this_02);
        sVar10 = RepeatedField<unsigned_int>::SpaceUsedExcludingSelfLong(this_04);
        sStack_20 = sVar10 + sStack_20;
        break;
      case CPPTYPE_UINT64:
        this_05 = GetRaw<google::protobuf::RepeatedField<unsigned_long>>(this,message,this_02);
        sVar10 = RepeatedField<unsigned_long>::SpaceUsedExcludingSelfLong(this_05);
        sStack_20 = sVar10 + sStack_20;
        break;
      case CPPTYPE_DOUBLE:
        this_06 = GetRaw<google::protobuf::RepeatedField<double>>(this,message,this_02);
        sVar10 = RepeatedField<double>::SpaceUsedExcludingSelfLong(this_06);
        sStack_20 = sVar10 + sStack_20;
        break;
      case CPPTYPE_FLOAT:
        this_07 = GetRaw<google::protobuf::RepeatedField<float>>(this,message,this_02);
        sVar10 = RepeatedField<float>::SpaceUsedExcludingSelfLong(this_07);
        sStack_20 = sVar10 + sStack_20;
        break;
      case CPPTYPE_BOOL:
        this_08 = GetRaw<google::protobuf::RepeatedField<bool>>(this,message,this_02);
        sVar10 = RepeatedField<bool>::SpaceUsedExcludingSelfLong(this_08);
        sStack_20 = sVar10 + sStack_20;
        break;
      case CPPTYPE_ENUM:
        pRVar5 = GetRaw<google::protobuf::RepeatedField<int>>(this,message,this_02);
        sVar10 = RepeatedField<int>::SpaceUsedExcludingSelfLong(pRVar5);
        sStack_20 = sVar10 + sStack_20;
        break;
      case CPPTYPE_STRING:
        pFVar7 = FieldDescriptor::options(this_02);
        FieldOptions::ctype(pFVar7);
        this_09 = GetRaw<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                            (this,message,this_02);
        sVar10 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::SpaceUsedExcludingSelfLong(this_09);
        sStack_20 = sVar10 + sStack_20;
        break;
      case CPPTYPE_MESSAGE:
        bVar1 = anon_unknown_0::IsMapFieldInApi(this_02);
        if (bVar1) {
          this_10 = GetRaw<google::protobuf::internal::MapFieldBase>(this,message,this_02);
          sVar10 = MapFieldBase::SpaceUsedExcludingSelfLong(this_10);
        }
        else {
          this_11 = GetRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,this_02);
          sVar10 = RepeatedPtrFieldBase::
                   SpaceUsedExcludingSelfLong<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                             (this_11);
        }
        sStack_20 = sVar10 + sStack_20;
      }
    }
    else {
      pOVar6 = FieldDescriptor::containing_oneof(this_02);
      if (((pOVar6 == (OneofDescriptor *)0x0) ||
          (bVar1 = HasOneofField(this,message,this_02), bVar1)) &&
         (CVar3 = FieldDescriptor::cpp_type(this_02), 7 < CVar3 - CPPTYPE_INT32)) {
        if (CVar3 == CPPTYPE_STRING) {
          pFVar7 = FieldDescriptor::options(this_02);
          FieldOptions::ctype(pFVar7);
          pAVar8 = DefaultRaw<google::protobuf::internal::ArenaStringPtr>(this,this_02);
          psVar9 = ArenaStringPtr::Get_abi_cxx11_(pAVar8);
          pAVar8 = GetField<google::protobuf::internal::ArenaStringPtr>(this,message,this_02);
          str = ArenaStringPtr::Get_abi_cxx11_(pAVar8);
          if (str != psVar9) {
            sVar10 = StringSpaceUsedExcludingSelfLong(str);
            sStack_20 = sVar10 + 0x20 + sStack_20;
          }
        }
        else if ((CVar3 == CPPTYPE_MESSAGE) &&
                (bVar1 = ReflectionSchema::IsDefaultInstance(&this->schema_,message), !bVar1)) {
          ppMVar11 = GetRaw<google::protobuf::Message_const*>(this,message,this_02);
          if (*ppMVar11 != (Message *)0x0) {
            iVar4 = (*((*ppMVar11)->super_MessageLite)._vptr_MessageLite[0x14])();
            sStack_20 = CONCAT44(extraout_var,iVar4) + sStack_20;
          }
        }
      }
    }
  }
  return sStack_20;
}

Assistant:

size_t GeneratedMessageReflection::SpaceUsedLong(const Message& message) const {
  // object_size_ already includes the in-memory representation of each field
  // in the message, so we only need to account for additional memory used by
  // the fields.
  size_t total_size = schema_.GetObjectSize();

  total_size += GetUnknownFields(message).SpaceUsedExcludingSelfLong();

  if (schema_.HasExtensionSet()) {
    total_size += GetExtensionSet(message).SpaceUsedExcludingSelfLong();
  }
  for (int i = 0; i <= last_non_weak_field_index_; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->is_repeated()) {
      switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                                     \
        case FieldDescriptor::CPPTYPE_##UPPERCASE :                           \
          total_size += GetRaw<RepeatedField<LOWERCASE> >(message, field)     \
                          .SpaceUsedExcludingSelfLong();                      \
          break

        HANDLE_TYPE( INT32,  int32);
        HANDLE_TYPE( INT64,  int64);
        HANDLE_TYPE(UINT32, uint32);
        HANDLE_TYPE(UINT64, uint64);
        HANDLE_TYPE(DOUBLE, double);
        HANDLE_TYPE( FLOAT,  float);
        HANDLE_TYPE(  BOOL,   bool);
        HANDLE_TYPE(  ENUM,    int);
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_STRING:
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING:
              total_size += GetRaw<RepeatedPtrField<string> >(message, field)
                                .SpaceUsedExcludingSelfLong();
              break;
          }
          break;

        case FieldDescriptor::CPPTYPE_MESSAGE:
          if (IsMapFieldInApi(field)) {
            total_size += GetRaw<MapFieldBase>(message, field)
                              .SpaceUsedExcludingSelfLong();
          } else {
            // We don't know which subclass of RepeatedPtrFieldBase the type is,
            // so we use RepeatedPtrFieldBase directly.
            total_size +=
                GetRaw<RepeatedPtrFieldBase>(message, field)
                    .SpaceUsedExcludingSelfLong<GenericTypeHandler<Message> >();
          }

          break;
      }
    } else {
      if (field->containing_oneof() && !HasOneofField(message, field)) {
        continue;
      }
      switch (field->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32 :
        case FieldDescriptor::CPPTYPE_INT64 :
        case FieldDescriptor::CPPTYPE_UINT32:
        case FieldDescriptor::CPPTYPE_UINT64:
        case FieldDescriptor::CPPTYPE_DOUBLE:
        case FieldDescriptor::CPPTYPE_FLOAT :
        case FieldDescriptor::CPPTYPE_BOOL  :
        case FieldDescriptor::CPPTYPE_ENUM  :
          // Field is inline, so we've already counted it.
          break;

        case FieldDescriptor::CPPTYPE_STRING: {
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING: {
              // Initially, the string points to the default value stored in
              // the prototype. Only count the string if it has been changed
              // from the default value.
              const string* default_ptr =
                  &DefaultRaw<ArenaStringPtr>(field).Get();
              const string* ptr =
                  &GetField<ArenaStringPtr>(message, field).Get();

              if (ptr != default_ptr) {
                // string fields are represented by just a pointer, so also
                // include sizeof(string) as well.
                total_size +=
                    sizeof(*ptr) + StringSpaceUsedExcludingSelfLong(*ptr);
              }
              break;
            }
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_MESSAGE:
          if (schema_.IsDefaultInstance(message)) {
            // For singular fields, the prototype just stores a pointer to the
            // external type's prototype, so there is no extra memory usage.
          } else {
            const Message* sub_message = GetRaw<const Message*>(message, field);
            if (sub_message != NULL) {
              total_size += sub_message->SpaceUsedLong();
            }
          }
          break;
      }
    }
  }
  return total_size;
}